

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_ds.h
# Opt level: O2

void * stbds_hmput_key(void *a,size_t elemsize,void *key,size_t keysize,int mode)

{
  uchar uVar1;
  size_t sVar2;
  ulong uVar3;
  int iVar4;
  void *pvVar5;
  stbds_hash_index *psVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  void *__dest;
  char *pcVar10;
  ulong uVar11;
  stbds_hash_bucket *psVar12;
  size_t sVar13;
  stbds_hash_index *ot;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong local_80;
  long local_48;
  
  if (a == (void *)0x0) {
    pvVar5 = stbds_arrgrowf((void *)0x0,elemsize,0,1);
    memset(pvVar5,0,elemsize);
    *(long *)((long)pvVar5 + -0x20) = *(long *)((long)pvVar5 + -0x20) + 1;
    a = (void *)((long)pvVar5 + elemsize);
  }
  pvVar5 = (void *)((long)a - elemsize);
  ot = *(stbds_hash_index **)((long)pvVar5 + -0x10);
  if (ot == (stbds_hash_index *)0x0) {
    sVar13 = 8;
  }
  else {
    if (ot->used_count < ot->used_count_threshold) goto LAB_00107488;
    sVar13 = ot->slot_count * 2;
  }
  psVar6 = stbds_make_hash_index(sVar13,ot);
  if (ot == (stbds_hash_index *)0x0) {
    (psVar6->string).mode = 0 < mode;
  }
  else {
    free(ot);
  }
  *(stbds_hash_index **)((long)pvVar5 + -0x10) = psVar6;
  ot = psVar6;
LAB_00107488:
  if (mode < 1) {
    uVar7 = stbds_hash_bytes(key,keysize,ot->seed);
  }
  else {
    uVar7 = stbds_hash_string((char *)key,ot->seed);
  }
  uVar17 = uVar7 | 2;
  if (1 < uVar7) {
    uVar17 = uVar7;
  }
  sVar13 = ot->slot_count;
  psVar12 = ot->storage;
  uVar7 = 0xffffffffffffffff;
  local_48 = 8;
  uVar11 = uVar17;
  do {
    uVar11 = sVar13 - 1 & uVar11;
    uVar3 = uVar11 & 0xffffffffffffff8;
    uVar8 = uVar11 & 0xfffffffffffffff8;
    uVar14 = (ulong)((uint)uVar11 & 7);
    for (uVar16 = uVar14; uVar16 != 8; uVar16 = uVar16 + 1) {
      if (psVar12->hash[uVar3 * 2 + uVar16] == uVar17) {
        sVar2 = psVar12->index[uVar3 * 2 + uVar16];
        iVar4 = stbds_is_key_equal(a,elemsize,key,keysize,0,mode,sVar2);
        if (iVar4 != 0) {
          *(size_t *)((long)pvVar5 + -8) = sVar2;
          if (mode < 1) {
            return a;
          }
          ot->temp_key = *(char **)((long)a + elemsize * psVar12->index[uVar3 * 2 + uVar16]);
          return a;
        }
      }
      else {
        if (psVar12->hash[uVar3 * 2 + uVar16] == 0) goto LAB_00107610;
        if (((long)uVar7 < 0) && (psVar12->index[uVar3 * 2 + uVar16] == -2)) {
          uVar7 = uVar8 + uVar16;
        }
      }
    }
    for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
      if (psVar12->hash[uVar3 * 2 + uVar16] == uVar17) {
        sVar2 = psVar12->index[uVar3 * 2 + uVar16];
        iVar4 = stbds_is_key_equal(a,elemsize,key,keysize,0,mode,sVar2);
        if (iVar4 != 0) {
          *(size_t *)((long)pvVar5 + -8) = sVar2;
          return a;
        }
      }
      else {
        if (psVar12->hash[uVar3 * 2 + uVar16] == 0) goto LAB_00107610;
        if (((long)uVar7 < 0) && (psVar12->index[uVar3 * 2 + uVar16] == -2)) {
          uVar7 = uVar8 + uVar16;
        }
      }
    }
    uVar11 = uVar11 + local_48;
    local_48 = local_48 + 8;
  } while( true );
LAB_00107610:
  local_80 = uVar8 + uVar16;
  if (-1 < (long)uVar7) {
    ot->tombstone_count = ot->tombstone_count - 1;
    local_80 = uVar7;
  }
  ot->used_count = ot->used_count + 1;
  if (a == (void *)0x0) {
    uVar7 = 1;
    lVar15 = 0;
  }
  else {
    lVar15 = *(long *)((long)pvVar5 + -0x20);
    uVar7 = lVar15 + 1;
    if (uVar7 <= *(ulong *)((long)pvVar5 + -0x18)) goto LAB_001076b6;
  }
  pvVar5 = stbds_arrgrowf(pvVar5,elemsize,1,0);
  psVar12 = ot->storage;
LAB_001076b6:
  *(ulong *)((long)pvVar5 + -0x20) = uVar7;
  uVar7 = (ulong)((uint)local_80 & 7);
  psVar12->hash[(local_80 & 0xffffffffffffff8) * 2 + uVar7] = uVar17;
  psVar12->index[(local_80 & 0xffffffffffffff8) * 2 + uVar7] = lVar15 + -1;
  *(long *)((long)pvVar5 + -8) = lVar15 + -1;
  uVar1 = (ot->string).mode;
  if (uVar1 == '\x01') {
    *(void **)((long)pvVar5 + lVar15 * elemsize) = key;
    **(undefined8 **)((long)pvVar5 + -0x10) = key;
  }
  else if (uVar1 == '\x03') {
    pcVar10 = stbds_stralloc(&ot->string,(char *)key);
    *(char **)((long)pvVar5 + lVar15 * elemsize) = pcVar10;
    **(undefined8 **)((long)pvVar5 + -0x10) = pcVar10;
  }
  else if (uVar1 == '\x02') {
    sVar9 = strlen((char *)key);
    __dest = malloc(sVar9 + 1);
    memcpy(__dest,key,sVar9 + 1);
    *(void **)((long)pvVar5 + lVar15 * elemsize) = __dest;
    **(undefined8 **)((long)pvVar5 + -0x10) = __dest;
  }
  else {
    memcpy((void *)(lVar15 * elemsize + (long)pvVar5),key,keysize);
  }
  return (void *)((long)pvVar5 + elemsize);
}

Assistant:

void *stbds_hmput_key(void *a, size_t elemsize, void *key, size_t keysize, int mode)
{
  size_t keyoffset=0;
  void *raw_a;
  stbds_hash_index *table;

  if (a == NULL) {
    a = stbds_arrgrowf(0, elemsize, 0, 1);
    memset(a, 0, elemsize);
    stbds_header(a)->length += 1;
    // adjust a to point AFTER the default element
    a = STBDS_ARR_TO_HASH(a,elemsize);
  }

  // adjust a to point to the default element
  raw_a = a;
  a = STBDS_HASH_TO_ARR(a,elemsize);

  table = (stbds_hash_index *) stbds_header(a)->hash_table;

  if (table == NULL || table->used_count >= table->used_count_threshold) {
    stbds_hash_index *nt;
    size_t slot_count;

    slot_count = (table == NULL) ? STBDS_BUCKET_LENGTH : table->slot_count*2;
    nt = stbds_make_hash_index(slot_count, table);
    if (table)
      STBDS_FREE(NULL, table);
    else
      nt->string.mode = mode >= STBDS_HM_STRING ? STBDS_SH_DEFAULT : 0;
    stbds_header(a)->hash_table = table = nt;
    STBDS_STATS(++stbds_hash_grow);
  }

  // we iterate hash table explicitly because we want to track if we saw a tombstone
  {
    size_t hash = mode >= STBDS_HM_STRING ? stbds_hash_string((char*)key,table->seed) : stbds_hash_bytes(key, keysize,table->seed);
    size_t step = STBDS_BUCKET_LENGTH;
    size_t pos;
    ptrdiff_t tombstone = -1;
    stbds_hash_bucket *bucket;

    // stored hash values are forbidden from being 0, so we can detect empty slots to early out quickly
    if (hash < 2) hash += 2;

    pos = stbds_probe_position(hash, table->slot_count, table->slot_count_log2);

    for (;;) {
      size_t limit, i;
      STBDS_STATS(++stbds_hash_probes);
      bucket = &table->storage[pos >> STBDS_BUCKET_SHIFT];

      // start searching from pos to end of bucket
      for (i=pos & STBDS_BUCKET_MASK; i < STBDS_BUCKET_LENGTH; ++i) {
        if (bucket->hash[i] == hash) {
          if (stbds_is_key_equal(raw_a, elemsize, key, keysize, keyoffset, mode, bucket->index[i])) {
            stbds_temp(a) = bucket->index[i];
            if (mode >= STBDS_HM_STRING)
              stbds_temp_key(a) = * (char **) ((char *) raw_a + elemsize*bucket->index[i] + keyoffset);
            return STBDS_ARR_TO_HASH(a,elemsize);
          }
        } else if (bucket->hash[i] == 0) {
          pos = (pos & ~STBDS_BUCKET_MASK) + i;
          goto found_empty_slot;
        } else if (tombstone < 0) {
          if (bucket->index[i] == STBDS_INDEX_DELETED)
            tombstone = (ptrdiff_t) ((pos & ~STBDS_BUCKET_MASK) + i);
        }
      }

      // search from beginning of bucket to pos
      limit = pos & STBDS_BUCKET_MASK;
      for (i = 0; i < limit; ++i) {
        if (bucket->hash[i] == hash) {
          if (stbds_is_key_equal(raw_a, elemsize, key, keysize, keyoffset, mode, bucket->index[i])) {
            stbds_temp(a) = bucket->index[i];
            return STBDS_ARR_TO_HASH(a,elemsize);
          }
        } else if (bucket->hash[i] == 0) {
          pos = (pos & ~STBDS_BUCKET_MASK) + i;
          goto found_empty_slot;
        } else if (tombstone < 0) {
          if (bucket->index[i] == STBDS_INDEX_DELETED)
            tombstone = (ptrdiff_t) ((pos & ~STBDS_BUCKET_MASK) + i);
        }
      }

      // quadratic probing
      pos += step;
      step += STBDS_BUCKET_LENGTH;
      pos &= (table->slot_count-1);
    }
   found_empty_slot:
    if (tombstone >= 0) {
      pos = tombstone;
      --table->tombstone_count;
    }
    ++table->used_count;

    {
      ptrdiff_t i = (ptrdiff_t) stbds_arrlen(a);
      // we want to do stbds_arraddn(1), but we can't use the macros since we don't have something of the right type
      if ((size_t) i+1 > stbds_arrcap(a))
        *(void **) &a = stbds_arrgrowf(a, elemsize, 1, 0);
      raw_a = STBDS_ARR_TO_HASH(a,elemsize);

      STBDS_ASSERT((size_t) i+1 <= stbds_arrcap(a));
      stbds_header(a)->length = i+1;
      bucket = &table->storage[pos >> STBDS_BUCKET_SHIFT];
      bucket->hash[pos & STBDS_BUCKET_MASK] = hash;
      bucket->index[pos & STBDS_BUCKET_MASK] = i-1;
      stbds_temp(a) = i-1;

      switch (table->string.mode) {
         case STBDS_SH_STRDUP:  stbds_temp_key(a) = *(char **) ((char *) a + elemsize*i) = stbds_strdup((char*) key); break;
         case STBDS_SH_ARENA:   stbds_temp_key(a) = *(char **) ((char *) a + elemsize*i) = stbds_stralloc(&table->string, (char*)key); break;
         case STBDS_SH_DEFAULT: stbds_temp_key(a) = *(char **) ((char *) a + elemsize*i) = (char *) key; break;
         default:                memcpy((char *) a + elemsize*i, key, keysize); break;
      }
    }
    return STBDS_ARR_TO_HASH(a,elemsize);
  }
}